

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map.cc
# Opt level: O0

void __thiscall bloaty::RangeMap::Compress(RangeMap *this)

{
  uint64_t uVar1;
  _Base_ptr *pp_Var2;
  bool bVar3;
  __type_conflict _Var4;
  pointer ppVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  iterator it;
  iterator prev;
  map<unsigned_long,_bloaty::RangeMap::Entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
  *in_stack_ffffffffffffffa8;
  Entry *in_stack_ffffffffffffffb0;
  iterator __position;
  iterator in_stack_ffffffffffffffd0;
  _Self local_20;
  _Self local_18;
  _Base_ptr local_10;
  
  local_18._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_bloaty::RangeMap::Entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
       ::begin(in_stack_ffffffffffffffa8);
  local_10 = local_18._M_node;
LAB_001c51f7:
  do {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_bloaty::RangeMap::Entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
         ::end(in_stack_ffffffffffffffa8);
    bVar3 = std::operator!=(&local_18,&local_20);
    if (!bVar3) {
      return;
    }
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::
             operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
                         *)0x1c5228);
    __position._M_node = (_Base_ptr)ppVar5->first;
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::
             operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
                         *)0x1c523a);
    uVar1 = (ppVar5->second).size;
    pp_Var2 = (_Base_ptr *)&(__position._M_node)->_M_color;
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::
             operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
                         *)0x1c5255);
    if ((long)pp_Var2 + uVar1 == ppVar5->first) {
      ppVar5 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::
               operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
                           *)0x1c5270);
      in_stack_ffffffffffffffb0 = &ppVar5->second;
      std::_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> *)
                 0x1c5283);
      _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffffd0._M_node,in_RDI);
      if (_Var4) {
LAB_001c52ce:
        ppVar5 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::
                 operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
                             *)0x1c52d8);
        in_stack_ffffffffffffffa8 =
             (map<unsigned_long,_bloaty::RangeMap::Entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
              *)(ppVar5->second).size;
        ppVar5 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::
                 operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
                             *)0x1c52ea);
        (ppVar5->second).size =
             (uint64_t)
             (&(in_stack_ffffffffffffffa8->_M_t)._M_impl.field_0x0 + (ppVar5->second).size);
        std::_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::operator++
                  ((_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> *)
                   __position._M_node,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
        in_stack_ffffffffffffffd0 =
             std::
             map<unsigned_long,bloaty::RangeMap::Entry,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
             ::erase_abi_cxx11_((map<unsigned_long,_bloaty::RangeMap::Entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
                                 *)in_stack_ffffffffffffffb0,__position);
        goto LAB_001c51f7;
      }
      std::_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> *)
                 0x1c52a2);
      bVar3 = Entry::HasFallbackLabel(in_stack_ffffffffffffffb0);
      if (!bVar3) {
        std::_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::operator->
                  ((_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> *)
                   0x1c52bc);
        bVar3 = Entry::IsShortFallback(in_stack_ffffffffffffffb0);
        if (bVar3) goto LAB_001c52ce;
      }
    }
    local_10 = local_18._M_node;
    std::_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> *)
               in_stack_ffffffffffffffb0);
  } while( true );
}

Assistant:

void RangeMap::Compress() {
  auto prev = mappings_.begin();
  auto it = prev;
  while (it != mappings_.end()) {
    if (prev->first + prev->second.size == it->first &&
        (prev->second.label == it->second.label ||
         (!prev->second.HasFallbackLabel() && it->second.IsShortFallback()))) {
      prev->second.size += it->second.size;
      mappings_.erase(it++);
    } else {
      prev = it;
      ++it;
    }
  }
}